

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

Status cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  size_t sVar1;
  Status SVar2;
  string local_48;
  
  if (file == (char *)0x0) {
    SVar2.Kind_ = POSIX;
    SVar2.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar1 = strlen(file);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,file,file + sVar1);
    SVar2 = SetPermissions(&local_48,mode,honor_umask);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return SVar2;
}

Assistant:

Status SystemTools::SetPermissions(const char* file, mode_t mode,
                                   bool honor_umask)
{
  if (!file) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}